

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

InputMap * Omega_h::read_input_without_includes(InputMap *__return_storage_ptr__,path *path)

{
  char cVar1;
  bool bVar2;
  value_type *pvVar3;
  InputMap *pIVar4;
  undefined8 *puVar5;
  InputYamlReader reader;
  ifstream stream;
  storage_union local_3e8;
  long local_3d8;
  string local_3d0;
  Reader local_3b0;
  istream local_218 [520];
  
  pvVar3 = filesystem::path::c_str(path);
  std::ifstream::ifstream(local_218,pvVar3,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    pvVar3 = filesystem::path::c_str(path);
    fail("Couldn\'t open Input file \"%s\"\n",pvVar3);
  }
  InputYamlReader::InputYamlReader((InputYamlReader *)&local_3b0);
  filesystem::path::string_abi_cxx11_(&local_3d0,path);
  Reader::read_stream((any *)&local_3e8,&local_3b0,local_218,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  bVar2 = any::is_typed((any *)&local_3e8,(type_info *)&InputMap::typeinfo);
  if ((bVar2) && ((InputMap *)local_3e8.dynamic != (InputMap *)0x0)) {
    InputMap::InputMap(__return_storage_ptr__,(InputMap *)local_3e8.dynamic);
    if (local_3d8 != 0) {
      (**(code **)(local_3d8 + 8))(&local_3e8);
    }
    InputYamlReader::~InputYamlReader((InputYamlReader *)&local_3b0);
    pIVar4 = (InputMap *)std::ifstream::~ifstream(local_218);
    return pIVar4;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &PTR__bad_cast_004b86a8;
  __cxa_throw(puVar5,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static InputMap read_input_without_includes(
    Omega_h::filesystem::path const& path) {
  std::ifstream stream(path.c_str());
  if (!stream.is_open()) {
    Omega_h_fail("Couldn't open Input file \"%s\"\n", path.c_str());
  }
  Omega_h::InputYamlReader reader;
  auto result_any = reader.read_stream(stream, path.string());
  return any_cast<InputMap&&>(std::move(result_any));
}